

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_MultiplicationOrDivision<psy::C::BinaryExpressionSyntax>
          (TypeChecker *this,BinaryExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Type *pTVar4;
  Type *rightTy_local;
  Type *leftTy_local;
  BinaryExpressionSyntax *node_local;
  TypeChecker *this_local;
  
  iVar2 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xd9])();
  bVar1 = satisfyArithmeticTypeConstraint(this,leftTy,(SyntaxNode *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    iVar2 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xdb])();
    bVar1 = satisfyArithmeticTypeConstraint
                      (this,rightTy,(SyntaxNode *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      iVar2 = (*leftTy->_vptr_Type[5])();
      iVar3 = (*rightTy->_vptr_Type[5])();
      pTVar4 = &determineCommonRealType
                          (this,(BasicType *)CONCAT44(extraout_var_01,iVar2),
                           (BasicType *)CONCAT44(extraout_var_02,iVar3))->super_Type;
      this->ty_ = pTVar4;
      return Skip;
    }
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_MultiplicationOrDivision(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (!(satisfyArithmeticTypeConstraint(leftTy, node->left())
            && satisfyArithmeticTypeConstraint(rightTy, node->right()))) {
        return Action::Quit;
    }
    ty_ = determineCommonRealType(leftTy->asBasicType(), rightTy->asBasicType());

    return Action::Skip;
}